

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# revp.c
# Opt level: O3

EVaction INT_REVassoc_store_action
                   (CMConnection conn,EVstone stone_num,EVstone out_stone,int store_limit)

{
  int condition;
  CMFormat format;
  EV_int_response response;
  int local_48;
  EVstone local_44;
  EVstone local_40;
  int local_3c;
  undefined1 local_38 [4];
  EVaction local_34;
  
  condition = INT_CMCondition_get(conn->cm,conn);
  format = INT_CMlookup_format(conn->cm,EVassoc_store_action_req_formats);
  local_48 = condition;
  local_44 = stone_num;
  local_40 = out_stone;
  local_3c = store_limit;
  if (format == (CMFormat)0x0) {
    format = INT_CMregister_format(conn->cm,EVassoc_store_action_req_formats);
  }
  INT_CMCondition_set_client_data(conn->cm,condition,local_38);
  INT_CMwrite(conn,format,&local_48);
  INT_CMCondition_wait(conn->cm,condition);
  return local_34;
}

Assistant:

extern EVaction
INT_REVassoc_store_action(CMConnection conn, EVstone stone_num, EVstone out_stone, int store_limit)
{
    int cond;
    CMFormat f;
    EV_int_response response;
    EVassoc_store_action_request request;
    memset(&request, 0, sizeof(request));
    cond = INT_CMCondition_get(conn->cm, conn);
    f = INT_CMlookup_format(conn->cm, EVassoc_store_action_req_formats);
    request.stone_num = stone_num;
    request.out_stone = out_stone;
    request.store_limit = store_limit;
    request.condition_var = cond;
    if (f == NULL) {
        f = INT_CMregister_format(conn->cm, EVassoc_store_action_req_formats);
    }
    INT_CMCondition_set_client_data(conn->cm, cond, &response);
    INT_CMwrite(conn, f, &request);
    INT_CMCondition_wait(conn->cm, cond);
    return (EVaction) response.ret;
}